

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O3

void __thiscall
eos::fitting::RenderingParameters::RenderingParameters
          (RenderingParameters *this,ScaledOrthoProjectionParameters *ortho_params,int screen_width,
          int screen_height)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  ScaledOrthoProjectionParameters *pSVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  type mat;
  float fVar9;
  float fVar10;
  
  this->camera_type = Orthographic;
  (this->frustum).l = -1.0;
  (this->frustum).r = 1.0;
  (this->frustum).b = -1.0;
  (this->frustum).t = 1.0;
  fVar10 = ortho_params->ty;
  this->t_x = ortho_params->tx;
  this->t_y = fVar10;
  (this->t_z).super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float>
  ._M_engaged = false;
  (this->fov_y).super__Optional_base<float,_true,_true>._M_payload.
  super__Optional_payload_base<float>._M_engaged = false;
  this->screen_width = screen_width;
  this->screen_height = screen_height;
  fVar10 = (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
  fVar2 = (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[4];
  fVar3 = (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[8];
  fVar9 = fVar2 + fVar3 + fVar10;
  if (fVar9 <= 0.0) {
    pSVar5 = (ScaledOrthoProjectionParameters *)
             ((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array + 3);
    if (fVar2 <= fVar10) {
      pSVar5 = ortho_params;
    }
    pfVar1 = (pSVar5->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array + (fVar10 < fVar2);
    uVar6 = 2;
    if (fVar3 < *pfVar1 || fVar3 == *pfVar1) {
      uVar6 = (ulong)(fVar10 < fVar2);
    }
    lVar8 = 0;
    if (uVar6 + 1 != 3) {
      lVar8 = uVar6 + 1;
    }
    uVar4 = lVar8 - 2;
    if (lVar8 + 1U < 3) {
      uVar4 = lVar8 + 1U;
    }
    fVar10 = (((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[uVar6 * 4] -
              (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array[lVar8 * 4]) -
             (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[uVar4 * 4]) + 1.0;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    uVar7 = (ulong)(uint)((int)uVar6 << 2);
    *(float *)((long)(this->rotation).m_coeffs.
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                     array + uVar7) = fVar10 * 0.5;
    fVar10 = 0.5 / fVar10;
    (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] =
         ((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[lVar8 * 3 + uVar4] -
         (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[uVar4 * 3 + lVar8]) * fVar10;
    (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[lVar8] =
         ((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[uVar6 * 3 + lVar8] +
         *(float *)((long)(ortho_params->R).
                          super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + uVar7 + lVar8 * 0xc)) * fVar10;
    (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[uVar4] =
         ((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[uVar6 * 3 + uVar4] +
         *(float *)((long)(ortho_params->R).
                          super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + uVar7 + uVar4 * 0xc)) * fVar10;
  }
  else {
    fVar9 = fVar9 + 1.0;
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] = fVar9 * 0.5;
    fVar9 = 0.5 / fVar9;
    (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[0] =
         ((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[5] -
         (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[7]) * fVar9;
    (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[1] =
         ((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[6] -
         (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[2]) * fVar9;
    (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[2] =
         ((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[1] -
         (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[3]) * fVar9;
  }
  fVar10 = ortho_params->s;
  (this->frustum).l = 0.0;
  (this->frustum).r = (float)screen_width / fVar10;
  (this->frustum).b = 0.0;
  (this->frustum).t = (float)screen_height / fVar10;
  return;
}

Assistant:

RenderingParameters(ScaledOrthoProjectionParameters ortho_params, int screen_width, int screen_height)
        : camera_type(CameraType::Orthographic), t_x(ortho_params.tx), t_y(ortho_params.ty),
          screen_width(screen_width), screen_height(screen_height)
    {
        rotation = ortho_params.R; // converts the rotation matrix to a quaternion

        const float l = 0.0f;
        const float r = screen_width / ortho_params.s;
        const float b = 0.0f; // The b and t values are not tested for what happens if the SOP parameters
        const float t = screen_height / ortho_params.s; // were estimated on a non-flipped viewport.
        frustum = Frustum(l, r, b, t);
    }